

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_anti_exfil_signer_commit
              (secp256k1_context *ctx,secp256k1_ecdsa_s2c_opening *opening,uchar *msg32,
              uchar *seckey32,uchar *rand_commitment32)

{
  int iVar1;
  int local_158;
  uint local_154;
  int is_nonce_valid;
  uint count;
  secp256k1_ge r;
  secp256k1_gej rj;
  secp256k1_scalar k;
  uchar nonce32 [32];
  uchar *rand_commitment32_local;
  uchar *seckey32_local;
  uchar *msg32_local;
  secp256k1_ecdsa_s2c_opening *opening_local;
  secp256k1_context *ctx_local;
  
  local_154 = 0;
  local_158 = 0;
  iVar1 = secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx);
  if (iVar1 == 0) {
    secp256k1_callback_call
              (&ctx->illegal_callback,"secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)")
    ;
    ctx_local._4_4_ = 0;
  }
  else if (opening == (secp256k1_ecdsa_s2c_opening *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"opening != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (msg32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"msg32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (seckey32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"seckey32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (rand_commitment32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"rand_commitment32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    memset(k.d + 3,0,0x20);
    while (local_158 == 0) {
      iVar1 = nonce_function_rfc6979
                        ((uchar *)(k.d + 3),msg32,seckey32,(uchar *)0x0,rand_commitment32,local_154)
      ;
      if (iVar1 == 0) {
        secp256k1_callback_call
                  (&ctx->error_callback,"(cryptographically unreachable) generated bad nonce");
      }
      local_158 = secp256k1_scalar_set_b32_seckey
                            ((secp256k1_scalar *)&rj.infinity,(uchar *)(k.d + 3));
      secp256k1_declassify(ctx,&local_158,4);
      local_154 = local_154 + 1;
    }
    secp256k1_ecmult_gen
              (&ctx->ecmult_gen_ctx,(secp256k1_gej *)&r.infinity,(secp256k1_scalar *)&rj.infinity);
    secp256k1_ge_set_gej((secp256k1_ge *)&is_nonce_valid,(secp256k1_gej *)&r.infinity);
    secp256k1_ecdsa_s2c_opening_save(opening,(secp256k1_ge *)&is_nonce_valid);
    memset(k.d + 3,0,0x20);
    secp256k1_scalar_clear((secp256k1_scalar *)&rj.infinity);
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ecdsa_anti_exfil_signer_commit(const secp256k1_context* ctx, secp256k1_ecdsa_s2c_opening* opening, const unsigned char* msg32, const unsigned char* seckey32, const unsigned char* rand_commitment32) {
    unsigned char nonce32[32];
    secp256k1_scalar k;
    secp256k1_gej rj;
    secp256k1_ge r;
    unsigned int count = 0;
    int is_nonce_valid = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(opening != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(seckey32 != NULL);
    ARG_CHECK(rand_commitment32 != NULL);

    memset(nonce32, 0, 32);
    while (!is_nonce_valid) {
        /* cast to void* removes const qualifier, but secp256k1_nonce_function_default does not modify it */
        if (!secp256k1_nonce_function_default(nonce32, msg32, seckey32, NULL, (void*)rand_commitment32, count)) {
            secp256k1_callback_call(&ctx->error_callback, "(cryptographically unreachable) generated bad nonce");
        }
        is_nonce_valid = secp256k1_scalar_set_b32_seckey(&k, nonce32);
        /* The nonce is still secret here, but it being invalid is is less likely than 1:2^255. */
        secp256k1_declassify(ctx, &is_nonce_valid, sizeof(is_nonce_valid));
        count++;
    }

    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &rj, &k);
    secp256k1_ge_set_gej(&r, &rj);
    secp256k1_ecdsa_s2c_opening_save(opening, &r);
    memset(nonce32, 0, 32);
    secp256k1_scalar_clear(&k);
    return 1;
}